

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

Bool prvTidytidySetLanguage(ctmbstr languageCode)

{
  ulong in_RAX;
  languageDefinition *plVar1;
  size_t sVar2;
  languageDefinition *plVar3;
  Bool BVar4;
  char lang [3];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xff000000ffffffff;
  if (languageCode == (ctmbstr)0x0) {
    BVar4 = no;
  }
  else {
    prvTidytidyNormalizedLocaleName(languageCode);
    plVar1 = prvTidytidyTestLanguage(prvTidytidyNormalizedLocaleName::result);
    sVar2 = strlen(prvTidytidyNormalizedLocaleName::result);
    if (sVar2 < 3) {
      plVar3 = (languageDefinition *)0x0;
    }
    else {
      strncpy((char *)((long)&uStack_18 + 4),prvTidytidyNormalizedLocaleName::result,2);
      uStack_18._0_7_ = (uint7)(uint6)uStack_18;
      plVar3 = prvTidytidyTestLanguage((char *)((long)&uStack_18 + 4));
    }
    if (plVar3 != (languageDefinition *)0x0 && plVar1 != (languageDefinition *)0x0) {
      tidyLanguages.currentLanguage = plVar1;
      tidyLanguages.fallbackLanguage = plVar3;
    }
    if (plVar1 != (languageDefinition *)0x0 && plVar3 == (languageDefinition *)0x0) {
      tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
      tidyLanguages.currentLanguage = plVar1;
    }
    if (plVar3 != (languageDefinition *)0x0 && plVar1 == (languageDefinition *)0x0) {
      tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
      tidyLanguages.currentLanguage = plVar3;
    }
    BVar4 = (Bool)(plVar1 != (languageDefinition *)0x0 || plVar3 != (languageDefinition *)0x0);
  }
  return BVar4;
}

Assistant:

Bool TY_(tidySetLanguage)( ctmbstr languageCode )
{
    languageDefinition *dict1 = NULL;
    languageDefinition *dict2 = NULL;
    tmbstr wantCode = NULL;
    char lang[3] = "";
    
    if ( !languageCode || !(wantCode = TY_(tidyNormalizedLocaleName)( languageCode )) )
    {
        return no;
    }
    
    /* We want to use the specified language as the currentLanguage, and set
     fallback language as necessary. We have either a two or five digit code,
     either or both of which might be installed. Let's test both of them:
     */
    
    dict1 = TY_(tidyTestLanguage( wantCode ));  /* WANTED language */
    
    if ( strlen( wantCode ) > 2 )
    {
        strncpy(lang, wantCode, 2);
        lang[2] = '\0';
        dict2 = TY_(tidyTestLanguage( lang ) ); /* BACKUP language? */
    }
    
    if ( dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = dict2;
    }
    if ( dict1 && !dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict2;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && !dict2 )
    {
        /* No change. */
    }
    
    return dict1 || dict2;
}